

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

LispPTR releasingvmempage(LispPTR ptr)

{
  LispPTR LVar1;
  
  LVar1 = findptrsbuffer(ptr);
  if (LVar1 == 0) {
    LVar1 = 0;
  }
  else {
    if ((LVar1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar1);
    }
    *(uint *)(Lisp_world + (ulong)LVar1 + 6) = *(uint *)(Lisp_world + (ulong)LVar1 + 6) | 0x80000000
    ;
    LVar1 = 0x4c;
  }
  return LVar1;
}

Assistant:

LispPTR releasingvmempage(LispPTR ptr) {
  struct buf *bptr;
  LispPTR bufferptr = findptrsbuffer(ptr);

  if (bufferptr == NIL) return (NIL); /* Not in use, OK to reclaim it */

  bptr = (struct buf *)NativeAligned4FromLAddr(bufferptr);
  bptr->noreference = T; /* Mark the buffer free to use ?? */
  return (ATOM_T);
}